

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handshake.cc
# Opt level: O2

UniquePtr<SSL_HANDSHAKE> __thiscall bssl::ssl_handshake_new(bssl *this,SSL *ssl)

{
  SSL_CONFIG *pSVar1;
  bool bVar2;
  UniquePtr<SSL_HANDSHAKE> hs;
  SSL *ssl_local;
  
  ssl_local = ssl;
  hs._M_t.super___uniq_ptr_impl<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_bssl::SSL_HANDSHAKE_*,_false>._M_head_impl =
       (__uniq_ptr_data<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter,_true,_true>)
       New<bssl::SSL_HANDSHAKE,ssl_st*&>(&ssl_local);
  if ((tuple<bssl::SSL_HANDSHAKE_*,_bssl::internal::Deleter>)
      hs._M_t.super___uniq_ptr_impl<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_bssl::SSL_HANDSHAKE_*,_false>._M_head_impl !=
      (_Head_base<0UL,_bssl::SSL_HANDSHAKE_*,_false>)0x0) {
    bVar2 = SSLTranscript::Init((SSLTranscript *)
                                ((long)hs._M_t.
                                       super___uniq_ptr_impl<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_*,_bssl::internal::Deleter>
                                       .super__Head_base<0UL,_bssl::SSL_HANDSHAKE_*,_false>.
                                       _M_head_impl + 0x208));
    if (bVar2) {
      pSVar1 = (ssl_local->config)._M_t.
               super___uniq_ptr_impl<bssl::SSL_CONFIG,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_bssl::SSL_CONFIG_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_bssl::SSL_CONFIG_*,_false>._M_head_impl;
      *(SSL_CONFIG **)
       ((long)hs._M_t.super___uniq_ptr_impl<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_bssl::SSL_HANDSHAKE_*,_false>._M_head_impl + 8) = pSVar1;
      if (pSVar1 == (SSL_CONFIG *)0x0) {
        __assert_fail("hs->config",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake.cc"
                      ,0x6a,"UniquePtr<SSL_HANDSHAKE> bssl::ssl_handshake_new(SSL *)");
      }
      *(__uniq_ptr_data<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter,_true,_true> *)this =
           hs._M_t.super___uniq_ptr_impl<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_bssl::SSL_HANDSHAKE_*,_false>._M_head_impl;
      hs._M_t.super___uniq_ptr_impl<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_bssl::SSL_HANDSHAKE_*,_false>._M_head_impl =
           (__uniq_ptr_data<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter,_true,_true>)
           (__uniq_ptr_impl<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>)0x0;
      goto LAB_0013cfd2;
    }
  }
  *(undefined8 *)this = 0;
LAB_0013cfd2:
  std::unique_ptr<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>::~unique_ptr(&hs);
  return (__uniq_ptr_data<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter,_true,_true>)this;
}

Assistant:

UniquePtr<SSL_HANDSHAKE> ssl_handshake_new(SSL *ssl) {
  UniquePtr<SSL_HANDSHAKE> hs = MakeUnique<SSL_HANDSHAKE>(ssl);
  if (!hs || !hs->transcript.Init()) {
    return nullptr;
  }
  hs->config = ssl->config.get();
  if (!hs->config) {
    assert(hs->config);
    return nullptr;
  }
  return hs;
}